

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_stats.cpp
# Opt level: O3

string * __thiscall
duckdb::StringStats::ToString_abi_cxx11_
          (string *__return_storage_ptr__,StringStats *this,BaseStatistics *stats)

{
  StringStats *pSVar1;
  StringStats *pSVar2;
  uint __val;
  bool bVar3;
  char cVar4;
  char cVar5;
  uint uVar6;
  idx_t i_1;
  long lVar7;
  idx_t i;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  char *local_b0;
  uint local_a8;
  char local_a0 [16];
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pSVar1 = this + 0x28;
  lVar8 = 0;
  do {
    if ((char)pSVar1[lVar8] < '\x01') goto LAB_005f0e8c;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 8);
  lVar8 = 8;
LAB_005f0e8c:
  pSVar2 = this + 0x30;
  lVar7 = 0;
  do {
    if ((char)pSVar2[lVar7] < '\x01') goto LAB_005f0ea8;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 8);
  lVar7 = 8;
LAB_005f0ea8:
  local_70[0] = local_60;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"[Min: %s, Max: %s, Has Unicode: %s, Max String Length: %s]","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,pSVar1,pSVar1 + lVar8);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pSVar2,pSVar2 + lVar7);
  params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x13729dc;
  if (this[0x38] != (StringStats)0x0) {
    params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1381559;
  }
  if (this[0x39] == (StringStats)0x1) {
    __val = *(uint *)(this + 0x3c);
    cVar5 = '\x01';
    if (9 < __val) {
      uVar6 = __val;
      cVar4 = '\x04';
      do {
        cVar5 = cVar4;
        if (uVar6 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_005f0f95;
        }
        if (uVar6 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_005f0f95;
        }
        if (uVar6 < 10000) goto LAB_005f0f95;
        bVar3 = 99999 < uVar6;
        uVar6 = uVar6 / 10000;
        cVar4 = cVar5 + '\x04';
      } while (bVar3);
      cVar5 = cVar5 + '\x01';
    }
LAB_005f0f95:
    local_b0 = local_a0;
    ::std::__cxx11::string::_M_construct((ulong)&local_b0,cVar5);
    ::std::__detail::__to_chars_10_impl<unsigned_int>(local_b0,local_a8,__val);
  }
  else {
    local_b0 = local_a0;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"?","");
  }
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string,char_const*,std::__cxx11::string>
            (__return_storage_ptr__,(StringUtil *)local_70,&local_90,&local_50,params_1,
             (char *)&local_b0,in_stack_ffffffffffffff48);
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

string StringStats::ToString(const BaseStatistics &stats) {
	auto &string_data = StringStats::GetDataUnsafe(stats);
	idx_t min_len = GetValidMinMaxSubstring(string_data.min);
	idx_t max_len = GetValidMinMaxSubstring(string_data.max);
	return StringUtil::Format("[Min: %s, Max: %s, Has Unicode: %s, Max String Length: %s]",
	                          string(const_char_ptr_cast(string_data.min), min_len),
	                          string(const_char_ptr_cast(string_data.max), max_len),
	                          string_data.has_unicode ? "true" : "false",
	                          string_data.has_max_string_length ? to_string(string_data.max_string_length) : "?");
}